

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::XGLImporter::InternReadFile
          (XGLImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  bool bVar1;
  int iVar2;
  IOStream *__p;
  element_type *peVar3;
  DeadlyImportError *this_00;
  StreamReader<false,_false> *this_01;
  pointer pSVar4;
  uchar *puVar5;
  MemoryIOStream *this_02;
  IrrXMLReader *__p_00;
  element_type *peVar6;
  undefined4 extraout_var;
  size_type sVar7;
  aiMesh **__s;
  iterator __first;
  iterator __last;
  aiMaterial **__s_00;
  iterator __first_00;
  iterator __last_00;
  aiLight **ppaVar8;
  undefined1 *__src;
  ulong uVar9;
  allocator local_6b9;
  string local_6b8;
  pointer *local_698;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *materials;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes;
  TempScope scope;
  CIrrXML_IOStreamReader st;
  size_t have;
  string local_5b0;
  int local_58c;
  undefined1 local_588 [4];
  int ret;
  Bytef block [1024];
  size_t total;
  z_stream zstream;
  shared_ptr<Assimp::IOStream> local_108;
  unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
  local_f8;
  unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
  raw_reader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  shared_ptr<Assimp::IOStream> stream;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressed;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  XGLImporter *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this->m_scene = pScene;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"rb",&local_71);
  __p = IOSystem::Open(pIOHandler,pFile,&local_70);
  std::shared_ptr<Assimp::IOStream>::shared_ptr<Assimp::IOStream,void>
            ((shared_ptr<Assimp::IOStream> *)local_50,__p);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  peVar3 = std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> *)local_50);
  if (peVar3 != (element_type *)0x0) {
    BaseImporter::GetExtension((string *)&raw_reader,pFile);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &raw_reader,"zgl");
    std::__cxx11::string::~string((string *)&raw_reader);
    if (bVar1) {
      this_01 = (StreamReader<false,_false> *)operator_new(0x38);
      zstream.reserved._7_1_ = 1;
      std::shared_ptr<Assimp::IOStream>::shared_ptr
                (&local_108,(shared_ptr<Assimp::IOStream> *)local_50);
      StreamReader<false,_false>::StreamReader(this_01,&local_108,false);
      zstream.reserved._7_1_ = 0;
      std::
      unique_ptr<Assimp::StreamReader<false,false>,std::default_delete<Assimp::StreamReader<false,false>>>
      ::unique_ptr<std::default_delete<Assimp::StreamReader<false,false>>,void>
                ((unique_ptr<Assimp::StreamReader<false,false>,std::default_delete<Assimp::StreamReader<false,false>>>
                  *)&local_f8,this_01);
      std::shared_ptr<Assimp::IOStream>::~shared_ptr(&local_108);
      zstream.zfree = (free_func)0x0;
      zstream.state = (internal_state *)0x0;
      zstream.zalloc = (alloc_func)0x0;
      zstream.opaque._0_4_ = 0;
      inflateInit2_(&total,0xfffffff1,"1.2.11",0x70);
      pSVar4 = std::
               unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
               ::operator->(&local_f8);
      StreamReader<false,_false>::IncPtr(pSVar4,2);
      pSVar4 = std::
               unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
               ::operator->(&local_f8);
      total = (size_t)StreamReader<false,_false>::GetPtr(pSVar4);
      pSVar4 = std::
               unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
               ::operator->(&local_f8);
      zstream.next_in._0_4_ = StreamReader<false,_false>::GetRemainingSize(pSVar4);
      block[0x3f8] = '\0';
      block[0x3f9] = '\0';
      block[0x3fa] = '\0';
      block[0x3fb] = '\0';
      block[0x3fc] = '\0';
      block[0x3fd] = '\0';
      block[0x3fe] = '\0';
      block[0x3ff] = '\0';
      do {
        zstream.next_out._0_4_ = 0x400;
        zstream.total_in = (uLong)local_588;
        local_58c = inflate(&total,0);
        if ((local_58c != 1) && (local_58c != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_5b0,
                     "Failure decompressing this file using gzip, seemingly it is NOT a compressed .XGL file"
                     ,(allocator *)((long)&have + 7));
          LogFunctions<Assimp::XGLImporter>::ThrowException(&local_5b0);
          std::__cxx11::string::~string((string *)&local_5b0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&have + 7));
        }
        uVar9 = (ulong)(0x400 - (int)zstream.next_out);
        block._1016_8_ = block._1016_8_ + uVar9;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,block._1016_8_);
        puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
        __src = local_588;
        memcpy(puVar5 + (block._1016_8_ - uVar9),__src,uVar9);
      } while (local_58c != 1);
      inflateEnd(&total);
      this_02 = (MemoryIOStream *)
                Intern::AllocateFromAssimpHeap::operator_new
                          ((AllocateFromAssimpHeap *)0x28,(size_t)__src);
      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
      MemoryIOStream::MemoryIOStream(this_02,puVar5,block._1016_8_,false);
      std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::MemoryIOStream>
                ((__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> *)local_50,this_02);
      std::
      unique_ptr<Assimp::StreamReader<false,_false>,_std::default_delete<Assimp::StreamReader<false,_false>_>_>
      ::~unique_ptr(&local_f8);
    }
    peVar3 = std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> *)local_50);
    CIrrXML_IOStreamReader::CIrrXML_IOStreamReader((CIrrXML_IOStreamReader *)&scope.light,peVar3);
    __p_00 = irr::io::createIrrXMLReader((IFileReadCallBack *)&scope.light);
    std::__shared_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,(__gnu_cxx::_Lock_policy)2>::
    reset<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>
              ((__shared_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,(__gnu_cxx::_Lock_policy)2>
                *)&this->m_reader,__p_00);
    TempScope::TempScope((TempScope *)&meshes);
    while (bVar1 = ReadElement(this), bVar1) {
      peVar6 = std::
               __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_reader);
      iVar2 = (*peVar6->_vptr_IIrrXMLReader[0xd])();
      iVar2 = ASSIMP_stricmp((char *)CONCAT44(extraout_var,iVar2),"world");
      if (iVar2 == 0) {
        ReadWorld(this,(TempScope *)&meshes);
      }
    }
    materials = (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                &scope.materials._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_698 = &scope.meshes_linear.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
    sVar7 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)materials);
    if ((sVar7 == 0) ||
       (sVar7 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                          ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)local_698),
       sVar7 == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_6b8,"failed to extract data from XGL file, no meshes loaded",
                 &local_6b9);
      LogFunctions<Assimp::XGLImporter>::ThrowException(&local_6b8);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
    }
    sVar7 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)materials);
    this->m_scene->mNumMeshes = (uint)sVar7;
    uVar9 = (ulong)this->m_scene->mNumMeshes << 3;
    __s = (aiMesh **)operator_new__(uVar9);
    memset(__s,0,uVar9);
    this->m_scene->mMeshes = __s;
    __first = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin
                        ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)materials);
    __last = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end
                       ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)materials);
    std::
    copy<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,aiMesh**>
              ((__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               __first._M_current,
               (__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
               __last._M_current,this->m_scene->mMeshes);
    sVar7 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                      ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)local_698);
    this->m_scene->mNumMaterials = (uint)sVar7;
    uVar9 = (ulong)this->m_scene->mNumMaterials << 3;
    __s_00 = (aiMaterial **)operator_new__(uVar9);
    memset(__s_00,0,uVar9);
    this->m_scene->mMaterials = __s_00;
    __first_00 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::begin
                           ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)local_698);
    __last_00 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::end
                          ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)local_698);
    std::
    copy<__gnu_cxx::__normal_iterator<aiMaterial**,std::vector<aiMaterial*,std::allocator<aiMaterial*>>>,aiMaterial**>
              ((__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                )__first_00._M_current,
               (__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                )__last_00._M_current,this->m_scene->mMaterials);
    if (scope.materials_linear.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      this->m_scene->mNumLights = 1;
      ppaVar8 = (aiLight **)operator_new__(8);
      this->m_scene->mLights = ppaVar8;
      *this->m_scene->mLights =
           (aiLight *)
           scope.materials_linear.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      aiString::operator=((aiString *)
                          scope.materials_linear.
                          super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,&this->m_scene->mRootNode->mName
                         );
    }
    TempScope::dismiss((TempScope *)&meshes);
    TempScope::~TempScope((TempScope *)&meshes);
    CIrrXML_IOStreamReader::~CIrrXML_IOStreamReader((CIrrXML_IOStreamReader *)&scope.light);
    std::shared_ptr<Assimp::IOStream>::~shared_ptr((shared_ptr<Assimp::IOStream> *)local_50);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_c8,"Failed to open XGL/ZGL file ",pFile);
  std::operator+(&local_a8,&local_c8,"");
  DeadlyImportError::DeadlyImportError(this_00,&local_a8);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void XGLImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
#ifndef ASSIMP_BUILD_NO_COMPRESSED_XGL
    std::vector<Bytef> uncompressed;
#endif

    m_scene = pScene;
    std::shared_ptr<IOStream> stream( pIOHandler->Open( pFile, "rb"));

    // check whether we can read from the file
    if( stream.get() == NULL) {
        throw DeadlyImportError( "Failed to open XGL/ZGL file " + pFile + "");
    }

    // see if its compressed, if so uncompress it
    if (GetExtension(pFile) == "zgl") {
#ifdef ASSIMP_BUILD_NO_COMPRESSED_XGL
        ThrowException("Cannot read ZGL file since Assimp was built without compression support");
#else
        std::unique_ptr<StreamReaderLE> raw_reader(new StreamReaderLE(stream));

        // build a zlib stream
        z_stream zstream;
        zstream.opaque = Z_NULL;
        zstream.zalloc = Z_NULL;
        zstream.zfree  = Z_NULL;
        zstream.data_type = Z_BINARY;

        // raw decompression without a zlib or gzip header
        inflateInit2(&zstream, -MAX_WBITS);

        // skip two extra bytes, zgl files do carry a crc16 upfront (I think)
        raw_reader->IncPtr(2);

        zstream.next_in   = reinterpret_cast<Bytef*>( raw_reader->GetPtr() );
        zstream.avail_in  = raw_reader->GetRemainingSize();

        size_t total = 0l;

        // TODO: be smarter about this, decompress directly into heap buffer
        // and decompress the data .... do 1k chunks in the hope that we won't kill the stack
    #define MYBLOCK 1024
        Bytef block[MYBLOCK];
        int ret;
        do {
            zstream.avail_out = MYBLOCK;
            zstream.next_out = block;
            ret = inflate(&zstream, Z_NO_FLUSH);

            if (ret != Z_STREAM_END && ret != Z_OK) {
                ThrowException("Failure decompressing this file using gzip, seemingly it is NOT a compressed .XGL file");
            }
            const size_t have = MYBLOCK - zstream.avail_out;
            total += have;
            uncompressed.resize(total);
            memcpy(uncompressed.data() + total - have,block,have);
        }
        while (ret != Z_STREAM_END);

        // terminate zlib
        inflateEnd(&zstream);

        // replace the input stream with a memory stream
        stream.reset(new MemoryIOStream(reinterpret_cast<uint8_t*>(uncompressed.data()),total));
#endif
    }

    // construct the irrXML parser
    CIrrXML_IOStreamReader st(stream.get());
    m_reader.reset( createIrrXMLReader( ( IFileReadCallBack* ) &st ) );

    // parse the XML file
    TempScope scope;

    while (ReadElement())   {
        if (!ASSIMP_stricmp(m_reader->getNodeName(),"world")) {
            ReadWorld(scope);
        }
    }


    std::vector<aiMesh*>& meshes = scope.meshes_linear;
    std::vector<aiMaterial*>& materials = scope.materials_linear;
    if(!meshes.size() || !materials.size()) {
        ThrowException("failed to extract data from XGL file, no meshes loaded");
    }

    // copy meshes
    m_scene->mNumMeshes = static_cast<unsigned int>(meshes.size());
    m_scene->mMeshes = new aiMesh*[m_scene->mNumMeshes]();
    std::copy(meshes.begin(),meshes.end(),m_scene->mMeshes);

    // copy materials
    m_scene->mNumMaterials = static_cast<unsigned int>(materials.size());
    m_scene->mMaterials = new aiMaterial*[m_scene->mNumMaterials]();
    std::copy(materials.begin(),materials.end(),m_scene->mMaterials);

    if (scope.light) {
        m_scene->mNumLights = 1;
        m_scene->mLights = new aiLight*[1];
        m_scene->mLights[0] = scope.light;

        scope.light->mName = m_scene->mRootNode->mName;
    }

    scope.dismiss();
}